

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutengine.cpp
# Opt level: O2

void qGeomCalc(QList<QLayoutStruct> *chain,int start,int count,int pos,int space,int spacer)

{
  long lVar1;
  pointer pQVar2;
  long lVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  long in_FS_OFFSET;
  bool bVar21;
  int local_144;
  int local_134;
  int local_104;
  int local_100;
  undefined1 local_d0 [24];
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar11 = (long)start;
  lVar1 = (long)(count + start);
  lVar14 = lVar11 << 5;
  bVar5 = 1;
  iVar10 = -1;
  local_134 = 0;
  uVar13 = 0;
  local_144 = 0;
  uVar4 = 0;
  iVar19 = 0;
  iVar17 = 0;
  for (lVar12 = lVar11; lVar12 < lVar1; lVar12 = lVar12 + 1) {
    pQVar2 = QList<QLayoutStruct>::data(chain);
    (&pQVar2->done)[lVar14] = false;
    iVar18 = *(int *)((long)&pQVar2->stretch + lVar14);
    if ((&pQVar2->empty)[lVar14] == true) {
      bVar8 = (&pQVar2->expansive)[lVar14];
      if (bVar5 == 0) {
        bVar5 = 0;
      }
      else {
        bVar5 = (bVar8 ^ 1) & iVar18 < 1;
      }
    }
    else {
      bVar21 = -1 < iVar10;
      bVar5 = 0;
      iVar9 = iVar10;
      if (!bVar21) {
        iVar9 = 0;
      }
      iVar10 = spacer;
      if (spacer < 0) {
        iVar10 = *(int *)((long)&pQVar2->spacing + lVar14);
      }
      local_134 = local_134 + (uint)bVar21;
      local_144 = local_144 + iVar9;
      bVar8 = (&pQVar2->expansive)[lVar14];
    }
    iVar17 = iVar17 + *(int *)((long)&pQVar2->sizeHint + (ulong)(0 < iVar18) * 8 + lVar14);
    iVar19 = iVar19 + *(int *)((long)&pQVar2->minimumSize + lVar14);
    uVar4 = uVar4 + iVar18;
    uVar13 = uVar13 + bVar8;
    lVar14 = lVar14 + 0x20;
  }
  iVar19 = iVar19 + local_144;
  local_104 = spacer;
  if (space < iVar19) {
    if (-1 < spacer) {
      if (iVar19 < 1) {
        local_104 = 0;
      }
      else {
        local_104 = (spacer * space) / iVar19;
      }
      local_144 = local_104 * local_134;
    }
    local_d0._16_8_ = &local_b8;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
    local_d0._0_8_ = 0x20;
    local_d0._8_8_ = 0;
    lVar16 = (long)count;
    QVarLengthArray<int,_32LL>::reserve((QVarLengthArray<int,_32LL> *)local_d0,lVar16);
    lVar12 = lVar11 * 0x20 + 0xc;
    for (lVar14 = lVar11; lVar14 < lVar1; lVar14 = lVar14 + 1) {
      QVarLengthArray<int,_32LL>::append
                ((QVarLengthArray<int,_32LL> *)local_d0,
                 (int *)((long)&((chain->d).ptr)->stretch + lVar12));
      lVar12 = lVar12 + 0x20;
    }
    std::__sort<int*,__gnu_cxx::__ops::_Iter_less_iter>();
    lVar12 = 0;
    iVar10 = 0;
    iVar19 = 0;
    iVar17 = 0;
    while ((lVar12 < lVar16 && (iVar19 < space - local_144))) {
      iVar10 = *(int *)(local_d0._16_8_ + lVar12 * 4);
      iVar19 = iVar10 * count;
      lVar12 = lVar12 + 1;
      count = count + -1;
      iVar19 = iVar19 + iVar17;
      iVar17 = iVar17 + iVar10;
    }
    iVar19 = iVar19 - (space - local_144);
    iVar17 = count + 1;
    uVar20 = lVar11 * 0x20 | 0x1c;
    iVar18 = 0;
    for (lVar12 = lVar11; lVar12 < lVar1; lVar12 = lVar12 + 1) {
      iVar18 = iVar18 + iVar19 % iVar17;
      iVar9 = 0;
      if (iVar17 <= iVar18) {
        iVar9 = iVar17;
      }
      iVar6 = (iVar10 - iVar19 / iVar17) - (uint)(iVar17 <= iVar18);
      iVar18 = iVar18 - iVar9;
      pQVar2 = QList<QLayoutStruct>::data(chain);
      iVar9 = *(int *)((long)pQVar2 + (uVar20 - 0x10));
      if (iVar9 < iVar6) {
        iVar6 = iVar9;
      }
      *(int *)((long)&pQVar2->stretch + uVar20) = iVar6;
      *(undefined1 *)((long)pQVar2 + (uVar20 - 6)) = 1;
      uVar20 = uVar20 + 0x20;
    }
    QVarLengthArray<int,_32LL>::~QVarLengthArray((QVarLengthArray<int,_32LL> *)local_d0);
  }
  else {
    if (iVar17 + local_144 <= space) {
      local_144 = space - local_144;
      lVar14 = lVar11 << 5;
      for (lVar12 = lVar11; lVar12 < lVar1; lVar12 = lVar12 + 1) {
        pQVar2 = QList<QLayoutStruct>::data(chain);
        if ((&pQVar2->done)[lVar14] == false) {
          iVar10 = *(int *)((long)&pQVar2->stretch + lVar14);
          iVar17 = *(int *)((long)&pQVar2->sizeHint + (ulong)(0 < iVar10) * 8 + lVar14);
          if (iVar17 < *(int *)((long)&pQVar2->maximumSize + lVar14)) {
            if (((bVar5 != 0) || ((&pQVar2->empty)[lVar14] != true)) ||
               (bVar8 = (&pQVar2->expansive)[lVar14], iVar10 != 0 || (bool)bVar8 != false))
            goto LAB_002e51a7;
          }
          else {
            bVar8 = (&pQVar2->expansive)[lVar14];
          }
          *(int *)((long)&pQVar2->size + lVar14) = iVar17;
          (&pQVar2->done)[lVar14] = true;
          local_144 = local_144 - iVar17;
          uVar4 = uVar4 - iVar10;
          uVar13 = uVar13 - bVar8;
          count = count + -1;
        }
LAB_002e51a7:
        lVar14 = lVar14 + 0x20;
      }
      lVar12 = lVar11 * 0x20;
      local_100 = local_144;
      do {
        lVar15 = (long)local_100 * 0x100;
        iVar10 = 0;
        iVar17 = 0;
        lVar7 = 0;
        lVar14 = lVar12;
        for (lVar16 = lVar11; lVar16 < lVar1; lVar16 = lVar16 + 1) {
          pQVar2 = QList<QLayoutStruct>::data(chain);
          if ((&pQVar2->done)[lVar14] == false) {
            if ((int)uVar4 < 1) {
              if ((int)uVar13 < 1) {
                lVar3 = lVar15 / (long)count;
              }
              else {
                lVar3 = (long)((ulong)(&pQVar2->expansive)[lVar14] * lVar15) / (long)(ulong)uVar13;
              }
            }
            else {
              lVar3 = (*(int *)((long)&pQVar2->stretch + lVar14) * lVar15) / (long)(ulong)uVar4;
            }
            lVar7 = lVar7 + lVar3;
            iVar18 = (uint)(0x7f < lVar7 % 0x100) + (int)(lVar7 / 0x100);
            *(int *)((long)&pQVar2->size + lVar14) = iVar18;
            lVar7 = lVar7 + (long)iVar18 * -0x100;
            iVar19 = *(int *)((long)&pQVar2->sizeHint +
                             (ulong)(0 < *(int *)((long)&pQVar2->stretch + lVar14)) * 8 + lVar14);
            if (iVar18 < iVar19) {
              iVar17 = (iVar19 + iVar17) - iVar18;
              local_144 = 0;
            }
            else {
              iVar19 = *(int *)((long)&pQVar2->maximumSize + lVar14);
              local_144 = 0;
              if (iVar19 < iVar18) {
                iVar10 = (iVar10 + iVar18) - iVar19;
              }
            }
          }
          lVar14 = lVar14 + 0x20;
        }
        if ((0 < iVar17) && (lVar14 = lVar11, lVar16 = lVar12, iVar10 <= iVar17)) {
          for (; lVar14 < lVar1; lVar14 = lVar14 + 1) {
            pQVar2 = QList<QLayoutStruct>::data(chain);
            if ((&pQVar2->done)[lVar16] == false) {
              iVar19 = *(int *)((long)&pQVar2->stretch + lVar16);
              iVar18 = *(int *)((long)&pQVar2->sizeHint + (ulong)(0 < iVar19) * 8 + lVar16);
              if (*(int *)((long)&pQVar2->size + lVar16) < iVar18) {
                *(int *)((long)&pQVar2->size + lVar16) = iVar18;
                (&pQVar2->done)[lVar16] = true;
                local_100 = local_100 - iVar18;
                uVar4 = uVar4 - iVar19;
                uVar13 = uVar13 - (&pQVar2->expansive)[lVar16];
                count = count + -1;
              }
            }
            lVar16 = lVar16 + 0x20;
          }
        }
        if ((0 < iVar10) && (lVar14 = lVar12 + 0x1c, lVar16 = lVar11, iVar17 <= iVar10)) {
          for (; lVar16 < lVar1; lVar16 = lVar16 + 1) {
            pQVar2 = QList<QLayoutStruct>::data(chain);
            if ((*(char *)((long)pQVar2 + lVar14 + -6) == '\0') &&
               (iVar19 = *(int *)((long)pQVar2 + lVar14 + -0x14),
               iVar19 < *(int *)((long)&pQVar2->stretch + lVar14))) {
              *(int *)((long)&pQVar2->stretch + lVar14) = iVar19;
              *(undefined1 *)((long)pQVar2 + lVar14 + -6) = 1;
              uVar4 = uVar4 - *(int *)((long)pQVar2 + lVar14 + -0x1c);
              local_100 = local_100 - iVar19;
              uVar13 = uVar13 - *(byte *)((long)pQVar2 + lVar14 + -8);
              count = count + -1;
            }
            lVar14 = lVar14 + 0x20;
          }
        }
      } while ((0 < count) && (iVar10 != iVar17));
      if (count == 0) {
        local_144 = local_100;
      }
      goto LAB_002e568f;
    }
    lVar14 = lVar11 << 5;
    for (lVar12 = lVar11; lVar12 < lVar1; lVar12 = lVar12 + 1) {
      pQVar2 = QList<QLayoutStruct>::data(chain);
      if (((&pQVar2->done)[lVar14] == false) &&
         (iVar10 = *(int *)((long)&pQVar2->sizeHint +
                           (ulong)(0 < *(int *)((long)&pQVar2->stretch + lVar14)) * 8 + lVar14),
         iVar10 <= *(int *)((long)&pQVar2->minimumSize + lVar14))) {
        *(int *)((long)&pQVar2->size + lVar14) = iVar10;
        (&pQVar2->done)[lVar14] = true;
        count = count + -1;
      }
      lVar14 = lVar14 + 0x20;
    }
    iVar17 = (local_144 - space) + iVar17;
    bVar21 = count == 0;
LAB_002e51c8:
    while (!bVar21) {
      lVar16 = 0;
      lVar12 = lVar11 << 5;
      for (lVar14 = lVar11; bVar21 = lVar1 <= lVar14, lVar14 < lVar1; lVar14 = lVar14 + 1) {
        pQVar2 = QList<QLayoutStruct>::data(chain);
        if ((&pQVar2->done)[lVar12] == false) {
          lVar16 = ((long)iVar17 << 8) / (long)count + lVar16;
          iVar18 = (uint)(0x7f < lVar16 % 0x100) + (int)(lVar16 / 0x100);
          iVar10 = *(int *)((long)&pQVar2->sizeHint +
                           (ulong)(0 < *(int *)((long)&pQVar2->stretch + lVar12)) * 8 + lVar12);
          iVar9 = iVar10 - iVar18;
          *(int *)((long)&pQVar2->size + lVar12) = iVar9;
          iVar19 = *(int *)((long)&pQVar2->minimumSize + lVar12);
          if (iVar9 < iVar19) {
            (&pQVar2->done)[lVar12] = true;
            *(int *)((long)&pQVar2->size + lVar12) = iVar19;
            iVar17 = (iVar17 - iVar10) + iVar19;
            count = count + -1;
            goto LAB_002e51c8;
          }
          lVar16 = lVar16 + (long)iVar18 * -0x100;
        }
        lVar12 = lVar12 + 0x20;
      }
    }
  }
  local_144 = 0;
LAB_002e568f:
  local_144 = local_144 / (local_134 + 2);
  iVar10 = pos + local_144;
  uVar20 = lVar11 << 5 | 0x1c;
  for (; lVar11 < lVar1; lVar11 = lVar11 + 1) {
    pQVar2 = QList<QLayoutStruct>::data(chain);
    *(int *)((long)pQVar2 + (uVar20 - 4)) = iVar10;
    iVar10 = iVar10 + *(int *)((long)&pQVar2->stretch + uVar20);
    if (*(char *)((long)pQVar2 + (uVar20 - 7)) == '\0') {
      iVar17 = local_104;
      if (local_104 < 0) {
        iVar17 = *(int *)((long)pQVar2 + (uVar20 - 0xc));
      }
      iVar10 = iVar10 + local_144 + iVar17;
    }
    uVar20 = uVar20 + 0x20;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void qGeomCalc(QList<QLayoutStruct> &chain, int start, int count, int pos, int space, int spacer)
{
    int cHint = 0;
    int cMin = 0;
    int sumStretch = 0;
    int sumSpacing = 0;
    int expandingCount = 0;

    bool allEmptyNonstretch = true;
    int pendingSpacing = -1;
    int spacerCount = 0;
    int i;

    for (i = start; i < start + count; i++) {
        QLayoutStruct *data = &chain[i];

        data->done = false;
        cHint += data->smartSizeHint();
        cMin += data->minimumSize;
        sumStretch += data->stretch;
        if (!data->empty) {
            /*
                Using pendingSpacing, we ensure that the spacing for the last
                (non-empty) item is ignored.
            */
            if (pendingSpacing >= 0) {
                sumSpacing += pendingSpacing;
                ++spacerCount;
            }
            pendingSpacing = data->effectiveSpacer(spacer);
        }
        if (data->expansive)
            expandingCount++;
        allEmptyNonstretch = allEmptyNonstretch && data->empty && !data->expansive && data->stretch <= 0;
    }

    int extraspace = 0;

    if (space < cMin + sumSpacing) {
        /*
          Less space than minimumSize; take from the biggest first
        */

        int minSize = cMin + sumSpacing;

        // shrink the spacers proportionally
        if (spacer >= 0) {
            spacer = minSize > 0 ? spacer * space / minSize : 0;
            sumSpacing = spacer * spacerCount;
        }

        QVarLengthArray<int, 32> minimumSizes;
        minimumSizes.reserve(count);

        for (i = start; i < start + count; i++)
            minimumSizes << chain.at(i).minimumSize;

        std::sort(minimumSizes.begin(), minimumSizes.end());

        int space_left = space - sumSpacing;

        int sum = 0;
        int idx = 0;
        int space_used=0;
        int current = 0;
        while (idx < count && space_used < space_left) {
            current = minimumSizes.at(idx);
            space_used = sum + current * (count - idx);
            sum += current;
            ++idx;
        }
        --idx;
        int deficit = space_used - space_left;

        int items = count - idx;
        /*
         * If we truncate all items to "current", we would get "deficit" too many pixels. Therefore, we have to remove
         * deficit/items from each item bigger than maxval. The actual value to remove is deficitPerItem + remainder/items
         * "rest" is the accumulated error from using integer arithmetic.
        */
        int deficitPerItem = deficit/items;
        int remainder = deficit % items;
        int maxval = current - deficitPerItem;

        int rest = 0;
        for (i = start; i < start + count; i++) {
            int maxv = maxval;
            rest += remainder;
            if (rest >= items) {
                maxv--;
                rest-=items;
            }
            QLayoutStruct *data = &chain[i];
            data->size = qMin(data->minimumSize, maxv);
            data->done = true;
        }
    } else if (space < cHint + sumSpacing) {
        /*
          Less space than smartSizeHint(), but more than minimumSize.
          Currently take space equally from each, as in Qt 2.x.
          Commented-out lines will give more space to stretchier
          items.
        */
        int n = count;
        int space_left = space - sumSpacing;
        int overdraft = cHint - space_left;

        // first give to the fixed ones:
        for (i = start; i < start + count; i++) {
            QLayoutStruct *data = &chain[i];
            if (!data->done
                 && data->minimumSize >= data->smartSizeHint()) {
                data->size = data->smartSizeHint();
                data->done = true;
                space_left -= data->smartSizeHint();
                // sumStretch -= data->stretch;
                n--;
            }
        }
        bool finished = n == 0;
        while (!finished) {
            finished = true;
            Fixed64 fp_over = toFixed(overdraft);
            Fixed64 fp_w = 0;

            for (i = start; i < start+count; i++) {
                QLayoutStruct *data = &chain[i];
                if (data->done)
                    continue;
                // if (sumStretch <= 0)
                fp_w += fp_over / n;
                // else
                //    fp_w += (fp_over * data->stretch) / sumStretch;
                int w = fRound(fp_w);
                data->size = data->smartSizeHint() - w;
                fp_w -= toFixed(w); // give the difference to the next
                if (data->size < data->minimumSize) {
                    data->done = true;
                    data->size = data->minimumSize;
                    finished = false;
                    overdraft -= data->smartSizeHint() - data->minimumSize;
                    // sumStretch -= data->stretch;
                    n--;
                    break;
                }
            }
        }
    } else { // extra space
        int n = count;
        int space_left = space - sumSpacing;
        // first give to the fixed ones, and handle non-expansiveness
        for (i = start; i < start + count; i++) {
            QLayoutStruct *data = &chain[i];
            if (!data->done
                && (data->maximumSize <= data->smartSizeHint()
                    || (!allEmptyNonstretch && data->empty &&
                        !data->expansive && data->stretch == 0))) {
                data->size = data->smartSizeHint();
                data->done = true;
                space_left -= data->size;
                sumStretch -= data->stretch;
                 if (data->expansive)
                     expandingCount--;
                n--;
            }
        }
        extraspace = space_left;

        /*
          Do a trial distribution and calculate how much it is off.
          If there are more deficit pixels than surplus pixels, give
          the minimum size items what they need, and repeat.
          Otherwise give to the maximum size items, and repeat.

          Paul Olav Tvete has a wonderful mathematical proof of the
          correctness of this principle, but unfortunately this
          comment is too small to contain it.
        */
        int surplus, deficit;
        do {
            surplus = deficit = 0;
            Fixed64 fp_space = toFixed(space_left);
            Fixed64 fp_w = 0;
            for (i = start; i < start + count; i++) {
                QLayoutStruct *data = &chain[i];
                if (data->done)
                    continue;
                extraspace = 0;
                if (sumStretch > 0) {
                    fp_w += (fp_space * data->stretch) / sumStretch;
                } else if (expandingCount > 0) {
                    fp_w += (fp_space * (data->expansive ? 1 : 0)) / expandingCount;
                } else {
                    fp_w += fp_space * 1 / n;
                }
                int w = fRound(fp_w);
                data->size = w;
                fp_w -= toFixed(w); // give the difference to the next
                if (w < data->smartSizeHint()) {
                    deficit +=  data->smartSizeHint() - w;
                } else if (w > data->maximumSize) {
                    surplus += w - data->maximumSize;
                }
            }
            if (deficit > 0 && surplus <= deficit) {
                // give to the ones that have too little
                for (i = start; i < start+count; i++) {
                    QLayoutStruct *data = &chain[i];
                    if (!data->done && data->size < data->smartSizeHint()) {
                        data->size = data->smartSizeHint();
                        data->done = true;
                        space_left -= data->smartSizeHint();
                        sumStretch -= data->stretch;
                        if (data->expansive)
                            expandingCount--;
                        n--;
                    }
                }
            }
            if (surplus > 0 && surplus >= deficit) {
                // take from the ones that have too much
                for (i = start; i < start + count; i++) {
                    QLayoutStruct *data = &chain[i];
                    if (!data->done && data->size > data->maximumSize) {
                        data->size = data->maximumSize;
                        data->done = true;
                        space_left -= data->maximumSize;
                        sumStretch -= data->stretch;
                        if (data->expansive)
                            expandingCount--;
                        n--;
                    }
                }
            }
        } while (n > 0 && surplus != deficit);
        if (n == 0)
            extraspace = space_left;
    }

    /*
      As a last resort, we distribute the unwanted space equally
      among the spacers (counting the start and end of the chain). We
      could, but don't, attempt a sub-pixel allocation of the extra
      space.
    */
    int extra = extraspace / (spacerCount + 2);
    int p = pos + extra;
    for (i = start; i < start+count; i++) {
        QLayoutStruct *data = &chain[i];
        data->pos = p;
        p += data->size;
        if (!data->empty)
            p += data->effectiveSpacer(spacer) + extra;
    }

#ifdef QLAYOUT_EXTRA_DEBUG
    qDebug() << "qGeomCalc" << "start" << start <<  "count" << count <<  "pos" << pos
             <<  "space" << space <<  "spacer" << spacer;
    for (i = start; i < start + count; ++i) {
        qDebug() << i << ':' << chain[i].minimumSize << chain[i].smartSizeHint()
                 << chain[i].maximumSize << "stretch" << chain[i].stretch
                 << "empty" << chain[i].empty << "expansive" << chain[i].expansive
                 << "spacing" << chain[i].spacing;
        qDebug() << "result pos" << chain[i].pos << "size" << chain[i].size;
    }
#endif
}